

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDFaceCornerDex __thiscall ON_SubDComponentId::FaceCornerDex(ON_SubDComponentId *this)

{
  bool bVar1;
  uint blow;
  ON_SubDFaceCornerDex *this_00;
  ON_SubDFaceCornerDex cid;
  ON_SubDFaceCornerDex local_c;
  
  bVar1 = IsFaceId(this);
  if (bVar1) {
    this_00 = &local_c;
    ON_SubDFaceCornerDex::ON_SubDFaceCornerDex
              (this_00,(this->m_valueAB[2] & 0xf) << 8 | (uint)this->m_valueAB[0],
               (this->m_valueAB[2] & 0xfffffff0) << 4 | (uint)this->m_valueAB[0]);
    bVar1 = ON_SubDFaceCornerDex::IsSet(this_00);
    if (bVar1) goto LAB_005cdc05;
  }
  this_00 = &ON_SubDFaceCornerDex::Unset;
LAB_005cdc05:
  return *this_00;
}

Assistant:

const ON_SubDFaceCornerDex ON_SubDComponentId::FaceCornerDex() const
{
  if (IsFaceId())
  {
    const ON_SubDFaceCornerDex cid(this->Internal_ValueA(), this->Internal_ValueB());
    if (cid.IsSet())
      return cid;
  }
  return ON_SubDFaceCornerDex::Unset;
}